

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O0

void __thiscall
cm::uv_handle_deleter<uv_signal_s>::operator()
          (uv_handle_deleter<uv_signal_s> *this,uv_signal_t *handle)

{
  uv_signal_t *handle_local;
  uv_handle_deleter<uv_signal_s> *this_local;
  
  if (handle != (uv_signal_t *)0x0) {
    uv_signal_stop(handle);
    handle_default_delete<uv_signal_s>(handle);
  }
  return;
}

Assistant:

void operator()(uv_signal_t* handle) const
  {
    if (handle) {
      uv_signal_stop(handle);
      handle_default_delete(handle);
    }
  }